

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O2

uint32_t leb__HeapRead(leb_Heap *leb,leb_Node node)

{
  uint32_t uVar1;
  uint32_t uVar2;
  leb__HeapArgs args;
  leb__HeapArgs local_38;
  
  leb__CreateHeapArgs(&local_38,leb,node,(leb->maxDepth - node.depth) + 1);
  uVar1 = leb__BitFieldExtract(*local_38.bitFieldLSB,local_38.bitOffsetLSB,local_38.bitCountLSB);
  uVar2 = leb__BitFieldExtract(*local_38.bitFieldMSB,0,local_38.bitCountMSB);
  return uVar2 << ((byte)local_38.bitCountLSB & 0x1f) | uVar1;
}

Assistant:

static uint32_t leb__HeapRead(const leb_Heap *leb, const leb_Node node)
{
    return leb__HeapReadExplicit(leb, node, leb__NodeBitSize(leb, node));
}